

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_double_parser.h
# Opt level: O0

char * fast_double_parser::parse_float_strtod(char *ptr,double *outDouble)

{
  bool bVar1;
  int iVar2;
  double *in_RSI;
  char *in_RDI;
  double dVar3;
  char *endptr;
  char *local_20;
  double *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (parse_float_strtod(char_const*,double*)::c_locale == '\0') {
    iVar2 = __cxa_guard_acquire(&parse_float_strtod(char_const*,double*)::c_locale);
    if (iVar2 != 0) {
      parse_float_strtod::c_locale = (locale_t)newlocale(0x1fbf,"C",(__locale_t)0x0);
      __cxa_guard_release(&parse_float_strtod(char_const*,double*)::c_locale);
    }
  }
  dVar3 = strtod_l(local_10,&local_20,(__locale_t)parse_float_strtod::c_locale);
  *local_18 = dVar3;
  bVar1 = std::isfinite(*local_18);
  if (bVar1) {
    local_8 = local_20;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char * parse_float_strtod(const char *ptr, double *outDouble) {
  char *endptr;
#if defined(FAST_DOUBLE_PARSER_SOLARIS) || defined(FAST_DOUBLE_PARSER_CYGWIN) 
  // workround for cygwin, solaris
  *outDouble = cygwin_strtod_l(ptr, &endptr);
#elif defined(_WIN32)
  static _locale_t c_locale = _create_locale(LC_ALL, "C");
  *outDouble = _strtod_l(ptr, &endptr, c_locale);
#elif defined(__PASE__)
  *outDouble = strtod(ptr, &endptr);
#else
  static locale_t c_locale = newlocale(LC_ALL_MASK, "C", NULL);
  *outDouble = strtod_l(ptr, &endptr, c_locale);
#endif
  // Some libraries will set errno = ERANGE when the value is subnormal,
  // yet we may want to be able to parse subnormal values.
  // However, we do not want to tolerate NAN or infinite values.
  // There isno realistic application where you might need values so large than
  // they can't fit in binary64. The maximal value is about  1.7976931348623157
  // × 10^308 It is an unimaginable large number. There will never be any piece
  // of engineering involving as many as 10^308 parts. It is estimated that
  // there are about 10^80 atoms in the universe. The estimate for the total
  // number of electrons is similar. Using a double-precision floating-point
  // value, we can represent easily the number of atoms in the universe. We
  // could  also represent the number of ways you can pick any three individual
  // atoms at random in the universe.
  if (!std::isfinite(*outDouble)) {
    return nullptr;
  }
  return endptr;
}